

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall
Catch::ListenerRegistrar<Catch2ApprovalListener>::ListenerRegistrar
          (ListenerRegistrar<Catch2ApprovalListener> *this)

{
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar1;
  shared_ptr<Catch::ListenerRegistrar<Catch2ApprovalListener>::ListenerFactory> sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  undefined1 local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  pSVar1 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  sVar2 = clara::std::make_shared<Catch::ListenerRegistrar<Catch2ApprovalListener>::ListenerFactory>
                    ();
  a_Stack_30[0]._M_pi = _Stack_40._M_pi;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (*(pSVar1->super_RegistryHub).super_IMutableRegistryHub._vptr_IMutableRegistryHub[3])
            (&(pSVar1->super_RegistryHub).super_IMutableRegistryHub,local_38,
             sVar2.
             super___shared_ptr<Catch::ListenerRegistrar<Catch2ApprovalListener>::ListenerFactory,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi._M_pi);
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  return;
}

Assistant:

static auto getMutable() -> MutableInterfaceT& {
            return *getInternal();
        }